

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O2

void __thiscall
spvtools::opt::LoopPeeling::FixExitCondition
          (LoopPeeling *this,
          function<unsigned_int_(spvtools::opt::Instruction_*)> *condition_builder)

{
  uint32_t *puVar1;
  Loop *this_00;
  bool bVar2;
  uint32_t uVar3;
  CFG *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  BasicBlock *this_02;
  Instruction *this_03;
  Instruction *pIVar5;
  DefUseManager *this_04;
  uint32_t *puVar6;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  uint local_64;
  iterator insert_point;
  SmallVector<unsigned_int,_2UL> local_58;
  
  this_01 = IRContext::cfg(this->context_);
  uVar3 = BasicBlock::id(this->cloned_loop_->loop_merge_);
  pvVar4 = CFG::preds(this_01,uVar3);
  puVar6 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (puVar6 == puVar1) goto LAB_002143d6;
    uVar3 = *puVar6;
    bVar2 = Loop::IsInsideLoop(this->cloned_loop_,uVar3);
    puVar6 = puVar6 + 1;
  } while (!bVar2);
  if (uVar3 != 0) {
    this_02 = CFG::block(this_01,uVar3);
    this_03 = BasicBlock::terminator(this_02);
    if (this_03->opcode_ == OpBranchConditional) {
      BasicBlock::tail((BasicBlock *)&insert_point);
      pIVar5 = BasicBlock::GetMergeInst(this_02);
      if (pIVar5 != (Instruction *)0x0) {
        insert_point.super_iterator.node_ =
             *(iterator *)((long)insert_point.super_iterator.node_ + 0x10);
      }
      local_64 = std::function<unsigned_int_(spvtools::opt::Instruction_*)>::operator()
                           (condition_builder,(Instruction *)insert_point.super_iterator.node_);
      init_list._M_len = 1;
      init_list._M_array = &local_64;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
      Instruction::SetInOperand(this_03,0,&local_58);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
      this_00 = this->cloned_loop_;
      uVar3 = Instruction::GetSingleWordInOperand(this_03,1);
      bVar2 = Loop::IsInsideLoop(this_00,uVar3);
      local_64 = Instruction::GetSingleWordInOperand(this_03,2 - bVar2);
      init_list_00._M_len = 1;
      init_list_00._M_array = &local_64;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_00);
      Instruction::SetInOperand(this_03,1,&local_58);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
      local_64 = BasicBlock::id(this->cloned_loop_->loop_merge_);
      init_list_01._M_len = 1;
      init_list_01._M_array = &local_64;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_01);
      Instruction::SetInOperand(this_03,2,&local_58);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
      this_04 = IRContext::get_def_use_mgr(this->context_);
      analysis::DefUseManager::AnalyzeInstUse(this_04,this_03);
      return;
    }
    __assert_fail("exit_condition->opcode() == spv::Op::OpBranchConditional",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x146,
                  "void spvtools::opt::LoopPeeling::FixExitCondition(const std::function<uint32_t (Instruction *)> &)"
                 );
  }
LAB_002143d6:
  __assert_fail("condition_block_id != 0 && \"2nd loop in improperly connected\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp"
                ,0x142,
                "void spvtools::opt::LoopPeeling::FixExitCondition(const std::function<uint32_t (Instruction *)> &)"
               );
}

Assistant:

void LoopPeeling::FixExitCondition(
    const std::function<uint32_t(Instruction*)>& condition_builder) {
  CFG& cfg = *context_->cfg();

  uint32_t condition_block_id = 0;
  for (uint32_t id : cfg.preds(GetClonedLoop()->GetMergeBlock()->id())) {
    if (GetClonedLoop()->IsInsideLoop(id)) {
      condition_block_id = id;
      break;
    }
  }
  assert(condition_block_id != 0 && "2nd loop in improperly connected");

  BasicBlock* condition_block = cfg.block(condition_block_id);
  Instruction* exit_condition = condition_block->terminator();
  assert(exit_condition->opcode() == spv::Op::OpBranchConditional);
  BasicBlock::iterator insert_point = condition_block->tail();
  if (condition_block->GetMergeInst()) {
    --insert_point;
  }

  exit_condition->SetInOperand(0, {condition_builder(&*insert_point)});

  uint32_t to_continue_block_idx =
      GetClonedLoop()->IsInsideLoop(exit_condition->GetSingleWordInOperand(1))
          ? 1
          : 2;
  exit_condition->SetInOperand(
      1, {exit_condition->GetSingleWordInOperand(to_continue_block_idx)});
  exit_condition->SetInOperand(2, {GetClonedLoop()->GetMergeBlock()->id()});

  // Update def/use manager.
  context_->get_def_use_mgr()->AnalyzeInstUse(exit_condition);
}